

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O0

string * __thiscall re2::Prog::Dump_abi_cxx11_(Prog *this)

{
  long in_RSI;
  Workq *in_RDI;
  Workq q;
  int in_stack_00000064;
  Prog *in_stack_00000068;
  int id;
  Workq *q_00;
  int in_stack_ffffffffffffffbc;
  SparseSetT<void> *in_stack_ffffffffffffffc0;
  undefined1 local_38 [56];
  
  if ((*(byte *)(in_RSI + 3) & 1) == 0) {
    id = (int)((ulong)local_38 >> 0x20);
    q_00 = in_RDI;
    SparseSetT<void>::SparseSetT(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    AddToQueue(q_00,id);
    ProgToString_abi_cxx11_
              (this,(Workq *)q.dense_.ptr_._M_t.
                             super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                             super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                             super__Head_base<0UL,_int_*,_false>._M_head_impl);
    SparseSetT<void>::~SparseSetT(q_00);
  }
  else {
    FlattenedProgToString_abi_cxx11_(in_stack_00000068,in_stack_00000064);
  }
  return (string *)in_RDI;
}

Assistant:

std::string Prog::Dump() {
  if (did_flatten_)
    return FlattenedProgToString(this, start_);

  Workq q(size_);
  AddToQueue(&q, start_);
  return ProgToString(this, &q);
}